

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

void __thiscall imrt::Volume::Volume(Volume *this,Collimator *collimator,string *deposition_file)

{
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000488;
  Volume *in_stack_00000490;
  string local_38 [56];
  
  *in_RDI = in_RSI;
  std::
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
  map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
       *)0x157378);
  std::__cxx11::string::string(local_38,in_RDX);
  set_data(in_stack_00000490,in_stack_00000488);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Volume::Volume(Collimator& collimator, string deposition_file) :
		collimator(collimator) {
  set_data(deposition_file);
}